

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O0

void __thiscall cmLinkItem::cmLinkItem(cmLinkItem *this)

{
  cmLinkItem *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->Target = (cmGeneratorTarget *)0x0;
  this->ObjectSource = (cmSourceFile *)0x0;
  std::__cxx11::string::string((string *)&this->Feature);
  this->Cross = false;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  return;
}

Assistant:

cmLinkItem::cmLinkItem() = default;